

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptSaveString(char ***argvp,uint argInfo,char *val)

{
  uint uVar1;
  int iVar2;
  char **ppcVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong limit;
  size_t __size;
  char **__ptr;
  
  if (val == (char *)0x0 || argvp == (char ***)0x0) {
    return -0x14;
  }
  __ptr = *argvp;
  if (__ptr == (char **)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0xffffffff;
    ppcVar3 = __ptr;
    do {
      uVar1 = uVar1 + 1;
      pcVar5 = *ppcVar3;
      ppcVar3 = ppcVar3 + 1;
    } while (pcVar5 != (char *)0x0);
  }
  uVar6 = (ulong)uVar1;
  __size = uVar6 * 8 + 0x10;
  ppcVar3 = (char **)realloc(__ptr,__size);
  if (ppcVar3 == (char **)0x0) {
    poptSaveString_cold_2();
  }
  else {
    *argvp = ppcVar3;
    sVar4 = strlen(val);
    __ptr = (char **)(sVar4 + 1);
    pcVar5 = (char *)malloc((size_t)__ptr);
    if (pcVar5 != (char *)0x0) {
      strcpy(pcVar5,val);
      ppcVar3[uVar6] = pcVar5;
      ppcVar3[uVar6 + 1] = (char *)0x0;
      return 0;
    }
  }
  poptSaveString_cold_1();
  iVar2 = -0x14;
  if (((ulong)__ptr & 7) == 0 && __ptr != (char **)0x0) {
    if (limit == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = limit;
      if ((((uint)__size >> 0x16 & 1) != 0) && (uVar6 = poptRandomValue(limit), (long)uVar6 < 0)) {
        return (int)uVar6;
      }
    }
    uVar1 = (uint)((__size & 0xffffffff) >> 0x19) & 7;
    iVar2 = -0x13;
    if (uVar1 < 5) {
      pcVar5 = (char *)(uVar6 ^ (long)((int)((uint)__size << 7) >> 0x1f));
      switch(uVar1) {
      case 0:
        *__ptr = pcVar5;
        break;
      case 1:
        *__ptr = (char *)((ulong)*__ptr ^ (ulong)pcVar5);
        break;
      case 2:
        *__ptr = (char *)((ulong)*__ptr & (ulong)pcVar5);
        break;
      case 3:
        goto switchD_001032ec_caseD_3;
      case 4:
        *__ptr = (char *)((ulong)*__ptr | (ulong)pcVar5);
      }
      iVar2 = 0;
    }
  }
switchD_001032ec_caseD_3:
  return iVar2;
}

Assistant:

int poptSaveString(const char *** argvp,
		UNUSED(unsigned int argInfo), const char * val)
{
    int argc = 0;

    if (argvp == NULL || val == NULL)
	return POPT_ERROR_NULLARG;

    /* XXX likely needs an upper bound on argc. */
    if (*argvp != NULL)
    while ((*argvp)[argc] != NULL)
	argc++;
 
    if ((*argvp = xrealloc(*argvp, (argc + 1 + 1) * sizeof(**argvp))) != NULL) {
	(*argvp)[argc++] = xstrdup(val);
	(*argvp)[argc  ] = NULL;
    }
    return 0;
}